

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O1

SyntaxTreeNode * __thiscall
RegexToDFAConverter::factor_eval(RegexToDFAConverter *this,string *expr,int *curr_pos)

{
  pointer *pppSVar1;
  char ch;
  int iVar2;
  iterator __position;
  bool bVar3;
  SyntaxTreeNode *this_00;
  char *pcVar4;
  int iVar5;
  _Hash_node_base *p_Var6;
  RegexToDFAConverter *this_01;
  _Hash_node_base *p_Var7;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  SyntaxTreeNode *son;
  int second;
  SyntaxTreeNode *local_58;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  string *local_48;
  undefined4 local_3c;
  SyntaxTreeNode *local_38;
  
  this_01 = (RegexToDFAConverter *)0x90;
  this_00 = (SyntaxTreeNode *)operator_new(0x90);
  (this_00->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->sons).
  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->first_pos)._M_h._M_buckets = &(this_00->first_pos)._M_h._M_single_bucket;
  (this_00->first_pos)._M_h._M_bucket_count = 1;
  (this_00->first_pos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->first_pos)._M_h._M_element_count = 0;
  (this_00->first_pos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->first_pos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->first_pos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->last_pos)._M_h._M_buckets = &(this_00->last_pos)._M_h._M_single_bucket;
  (this_00->last_pos)._M_h._M_bucket_count = 1;
  (this_00->last_pos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->last_pos)._M_h._M_element_count = 0;
  (this_00->last_pos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->last_pos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->last_pos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this_00->last_pos)._M_h._M_single_bucket + 5) = 0;
  iVar2 = *curr_pos;
  ch = (expr->_M_dataplus)._M_p[iVar2];
  local_48 = expr;
  if (ch == '$') {
    this_00->nullable = true;
  }
  else {
    local_50 = &(this_00->last_pos)._M_h;
    if (ch == '(') {
      *curr_pos = iVar2 + 1;
      local_58 = expression_eval(this,expr,curr_pos);
      if (local_58 != this_00) {
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this_00->first_pos,&(local_58->first_pos)._M_h);
      }
      if (local_58 != this_00) {
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_50,&(local_58->last_pos)._M_h);
      }
      __position._M_current =
           (this_00->sons).
           super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->sons).
          super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
        ::_M_realloc_insert<RegexToDFAConverter::SyntaxTreeNode*const&>
                  ((vector<RegexToDFAConverter::SyntaxTreeNode*,std::allocator<RegexToDFAConverter::SyntaxTreeNode*>>
                    *)this_00,__position,&local_58);
      }
      else {
        *__position._M_current = local_58;
        pppSVar1 = &(this_00->sons).
                    super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      this_00->nullable = local_58->nullable;
      SyntaxTreeNode::wipe_sons(this_00);
    }
    else {
      bVar3 = is_letter(this_01,ch);
      if ((ch == '#') || (bVar3)) {
        iVar2 = this->leaves_count_;
        this->leaves_count_ = iVar2 + 1;
        std::
        vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
        ::resize(&this->follow_pos_,(long)iVar2 + 2);
        std::vector<char,_std::allocator<char>_>::resize
                  (&this->what_letter_,(long)this->leaves_count_ + 1);
        this_00->nullable = false;
        local_58._0_4_ = this->leaves_count_;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_58;
        std::
        _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::operator=(&(this_00->first_pos)._M_h,__l);
        local_58 = (SyntaxTreeNode *)CONCAT44(local_58._4_4_,this->leaves_count_);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&local_58;
        std::
        _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::operator=(local_50,__l_00);
        iVar2 = this->leaves_count_;
        this_00->leaf_index = iVar2;
        (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2] = (local_48->_M_dataplus)._M_p[*curr_pos];
        expr = local_48;
      }
      else {
        this_00->nullable = true;
        *curr_pos = iVar2 + -1;
        expr = local_48;
      }
    }
  }
  iVar2 = *curr_pos;
  iVar5 = (int)((long)iVar2 + 1);
  *curr_pos = iVar5;
  local_38 = this_00;
  local_50 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)curr_pos;
  if ((iVar5 < (int)expr->_M_string_length) &&
     ((local_48->_M_dataplus)._M_p[(long)iVar2 + 1] == '*')) {
    this_00->nullable = true;
    p_Var7 = (this_00->last_pos)._M_h._M_before_begin._M_nxt;
    if (p_Var7 != (_Hash_node_base *)0x0) {
      do {
        p_Var6 = (local_38->first_pos)._M_h._M_before_begin._M_nxt;
        if (p_Var6 != (_Hash_node_base *)0x0) {
          iVar2 = *(int *)&p_Var7[1]._M_nxt;
          do {
            local_3c = *(undefined4 *)&p_Var6[1]._M_nxt;
            local_58 = (SyntaxTreeNode *)
                       ((this->follow_pos_).
                        super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar2);
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_58,&local_3c,&local_58);
            p_Var6 = p_Var6->_M_nxt;
          } while (p_Var6 != (_Hash_node_base *)0x0);
        }
        p_Var7 = p_Var7->_M_nxt;
      } while (p_Var7 != (_Hash_node_base *)0x0);
    }
  }
  iVar2 = (int)local_48->_M_string_length;
  iVar5 = *(int *)local_50;
  if (iVar5 < iVar2) {
    pcVar4 = (local_48->_M_dataplus)._M_p + iVar5;
    do {
      iVar5 = iVar5 + 1;
      if (*pcVar4 != '*') {
        return local_38;
      }
      *(int *)local_50 = iVar5;
      pcVar4 = pcVar4 + 1;
    } while (iVar5 != iVar2);
  }
  return local_38;
}

Assistant:

RegexToDFAConverter::SyntaxTreeNode* RegexToDFAConverter::factor_eval(
    const string &expr, int &curr_pos) {

  SyntaxTreeNode* root = new SyntaxTreeNode;
  if (expr[curr_pos] == '(') {
    curr_pos++;
    auto son = expression_eval(expr, curr_pos);
    root->first_pos = son->first_pos;
    root->last_pos = son->last_pos;
    root->sons.push_back(son);
    root->nullable = son->nullable;
    root->wipe_sons();
  }
  else {
    if (expr[curr_pos] == kLambda)
      root->nullable = true;
    else if (!is_letter(expr[curr_pos]) && expr[curr_pos] != '#')
      root->nullable = true, --curr_pos;
    else {
      ++leaves_count_;
      follow_pos_.resize((size_t)leaves_count_ + 1);
      what_letter_.resize((size_t)leaves_count_ + 1);
      root->nullable = false;
      root->first_pos = {leaves_count_};
      root->last_pos = {leaves_count_};
      root->leaf_index = leaves_count_;
      what_letter_[leaves_count_] = expr[curr_pos];
    }
  }

  if (++curr_pos < (int)expr.size() && expr[curr_pos] == '*') {
    root->nullable = true;
    for (int first : root->last_pos)
      for (int second : root->first_pos)
        follow_pos_[first].insert(second);
  }
  while (curr_pos < (int)expr.size() && expr[curr_pos] == '*')
    curr_pos++;
  return root;
}